

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_59::InMemoryFile::write(InMemoryFile *this,int __fd,void *__buf,size_t __n)

{
  uchar *puVar1;
  ssize_t in_RAX;
  long lVar2;
  ssize_t extraout_RAX;
  uint64_t uVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  Fault f;
  uint64_t offset_local;
  uint64_t end;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  
  uVar4 = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    offset_local = uVar4;
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&lock,&this->impl);
    lVar2 = (*(code *)**(undefined8 **)(lock.ptr)->clock)();
    ((lock.ptr)->lastModified).value.value = lVar2;
    end = uVar4 + __n;
    _kjCondition.left = &end;
    _kjCondition.right = &offset_local;
    _kjCondition.op.content.ptr = " >= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = end >= uVar4;
    if (end < uVar4) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[33]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x34a,FAILED,"end >= offset","_kjCondition,\"write() request overflows uint64\"",
                 &_kjCondition,(char (*) [33])"write() request overflows uint64");
      kj::_::Debug::Fault::fatal(&f);
    }
    Impl::ensureCapacity(lock.ptr,end);
    uVar3 = end;
    if (end < (lock.ptr)->size) {
      uVar3 = (lock.ptr)->size;
    }
    puVar1 = ((lock.ptr)->bytes).ptr;
    (lock.ptr)->size = uVar3;
    memcpy(puVar1 + offset_local,__buf,__n);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&lock);
    in_RAX = extraout_RAX;
  }
  return in_RAX;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const override {
    if (data.size() == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + data.size();
    KJ_REQUIRE(end >= offset, "write() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memcpy(lock->bytes.begin() + offset, data.begin(), data.size());
  }